

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

void __thiscall
S2Loop::EncodeCompressed(S2Loop *this,Encoder *encoder,S2XYZFaceSiTi *vertices,int snap_level)

{
  bool bVar1;
  _Base_bitset<1UL> _Var2;
  Span<const_S2XYZFaceSiTi> points;
  bitset<2UL> properties;
  
  Encoder::Ensure(encoder,5);
  Encoder::put_varint32(encoder,this->num_vertices_);
  points.len_ = (size_type)this->num_vertices_;
  points.ptr_ = vertices;
  S2EncodePointsCompressed(points,snap_level,encoder);
  _Var2._M_w = (_WordT)GetCompressedEncodingProperties(this);
  properties.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)_Var2._M_w;
  Encoder::Ensure(encoder,10);
  Encoder::put_varint32(encoder,(uint32)_Var2._M_w);
  Encoder::put_varint32(encoder,this->depth_);
  bVar1 = std::bitset<2UL>::test(&properties,1);
  if (bVar1) {
    S2LatLngRect::Encode(&this->bound_,encoder);
  }
  Encoder::avail(encoder);
  return;
}

Assistant:

void S2Loop::EncodeCompressed(Encoder* encoder, const S2XYZFaceSiTi* vertices,
                              int snap_level) const {
  // Ensure enough for the data we write before S2EncodePointsCompressed.
  // S2EncodePointsCompressed ensures its space.
  encoder->Ensure(Encoder::kVarintMax32);
  encoder->put_varint32(num_vertices_);

  S2EncodePointsCompressed(MakeSpan(vertices, num_vertices_),
                           snap_level, encoder);

  std::bitset<kNumProperties> properties = GetCompressedEncodingProperties();

  // Ensure enough only for what we write.  Let the bound ensure its own
  // space.
  encoder->Ensure(2 * Encoder::kVarintMax32);
  encoder->put_varint32(properties.to_ulong());
  encoder->put_varint32(depth_);
  if (properties.test(kBoundEncoded)) {
    bound_.Encode(encoder);
  }
  S2_DCHECK_GE(encoder->avail(), 0);
}